

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_type.hpp
# Opt level: O3

void __thiscall
ExchCXX::detail::BuiltinKernelImpl<ExchCXX::BuiltinPBE_X,void>::
eval_exc_vxc_inc_<double&,int&,double_const*&,double_const*&,double*&,double*&,double*&>
          (BuiltinKernelImpl<ExchCXX::BuiltinPBE_X,void> *this,double *args,int *args_1,
          double **args_2,double **args_3,double **args_4,double **args_5,double **args_6)

{
  double scal_fact;
  double __x;
  uint N;
  const_host_buffer_type rho;
  const_host_buffer_type sigma;
  host_buffer_type eps;
  host_buffer_type vrho;
  host_buffer_type vsigma;
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  scal_fact = *args;
  N = *args_1;
  rho = *args_2;
  sigma = *args_3;
  eps = *args_4;
  vrho = *args_5;
  vsigma = *args_6;
  if (*(int *)(this + 8) == 0) {
    host_eval_exc_vxc_inc_helper_polar<ExchCXX::BuiltinPBE_X>(scal_fact,N,rho,sigma,eps,vrho,vsigma)
    ;
    return;
  }
  if (0 < (int)N) {
    uVar1 = 0;
    do {
      __x = rho[uVar1];
      dVar9 = 0.0;
      dVar7 = 0.0;
      dVar4 = 0.0;
      if (1e-32 < __x) {
        dVar4 = sigma[uVar1];
        dVar7 = 4.64158883361283e-86;
        if (4.64158883361283e-86 <= dVar4) {
          dVar7 = dVar4;
        }
        dVar9 = __x * 0.5;
        dVar2 = cbrt(1.0);
        dVar3 = cbrt(__x);
        dVar5 = __x * __x;
        dVar4 = (dVar7 * 0.08669247488762274 * 1.5874010519681996 *
                ((1.0 / (dVar3 * dVar3)) / dVar5)) / 24.0 + 0.804;
        dVar6 = (1.0 - 0.804 / dVar4) * 0.804 + 1.0;
        dVar10 = (1.0 / (dVar4 * dVar4)) * 0.2195149727645171;
        dVar8 = 0.0;
        if (1e-32 < dVar9) {
          dVar8 = ((dVar2 * -0.9847450218426964) / (dVar3 * dVar3)) * dVar6 * 0.125 +
                  ((((dVar2 * 0.9847450218426964) / dVar3) / (__x * dVar5)) * 0.6464160000000001 *
                  dVar10 * 1.8171205928321397 * dVar7 * 0.21733691746289932 * 1.5874010519681996) /
                  24.0;
        }
        dVar4 = 0.0;
        if (1e-32 < dVar9) {
          dVar4 = dVar10 * 0.6269081516456065 *
                  (((dVar2 * -0.9847450218426964) / dVar3) / dVar5) * 0.6464160000000001 * 0.015625;
        }
        dVar6 = dVar2 * -0.36927938319101117 * dVar3 * dVar6;
        dVar9 = (double)(~-(ulong)(dVar9 <= 1e-32) & (ulong)(dVar6 + dVar6));
        dVar7 = dVar8 * (__x + __x) + dVar9;
        dVar4 = (__x + __x) * dVar4;
      }
      eps[uVar1] = dVar9 * scal_fact + eps[uVar1];
      vrho[uVar1] = dVar7 * scal_fact + vrho[uVar1];
      vsigma[uVar1] = dVar4 * scal_fact + vsigma[uVar1];
      uVar1 = uVar1 + 1;
    } while (N != uVar1);
  }
  return;
}

Assistant:

void eval_exc_vxc_inc_(Args&&... args) const {
    if( is_polarized() )
      host_eval_exc_vxc_inc_helper_polar<KernelType>(
        std::forward<Args>(args)...
      );
    else
      host_eval_exc_vxc_inc_helper_unpolar<KernelType>(
        std::forward<Args>(args)...
      );
  }